

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxForLoop::Emit(FxForLoop *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  size_t loopstart;
  undefined4 extraout_var_00;
  size_t loc;
  ExpEmit EVar4;
  TArray<unsigned_long,_unsigned_long> no;
  TArray<unsigned_long,_unsigned_long> yes;
  ExpEmit init;
  
  pFVar1 = this->Condition;
  if (pFVar1 != (FxExpression *)0x0) {
    if (pFVar1->ValueType == (PType *)TypeBool) {
      iVar2 = (*pFVar1->_vptr_FxExpression[3])();
      if (((char)iVar2 == '\0') || (this->Condition == (FxExpression *)0x0)) goto LAB_0051985b;
    }
    __assert_fail("(Condition && Condition->ValueType == TypeBool && !Condition->isConstant()) || Condition == nullptr"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x242e,"virtual ExpEmit FxForLoop::Emit(VMFunctionBuilder *)");
  }
LAB_0051985b:
  yes.Array = (unsigned_long *)0x0;
  yes.Most = 0;
  yes.Count = 0;
  no.Array = (unsigned_long *)0x0;
  no.Most = 0;
  no.Count = 0;
  pFVar1 = this->Init;
  if (pFVar1 != (FxExpression *)0x0) {
    init._0_4_ = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
    init.Konst = (bool)(char)extraout_var;
    init.Fixed = (bool)(char)((uint)extraout_var >> 8);
    init.Final = (bool)(char)((uint)extraout_var >> 0x10);
    init.Target = (bool)(char)((uint)extraout_var >> 0x18);
    ExpEmit::Free(&init,build);
  }
  sVar3 = VMFunctionBuilder::GetAddress(build);
  pFVar1 = this->Condition;
  if (pFVar1 != (FxExpression *)0x0) {
    (*pFVar1->_vptr_FxExpression[10])(pFVar1,build,0,&yes,&no);
  }
  VMFunctionBuilder::BackpatchListToHere(build,&yes);
  if (this->Code != (FxExpression *)0x0) {
    FxExpression::EmitStatement(this->Code,build);
  }
  loopstart = VMFunctionBuilder::GetAddress(build);
  pFVar1 = this->Iteration;
  if (pFVar1 != (FxExpression *)0x0) {
    init._0_4_ = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
    init.Konst = (bool)(char)extraout_var_00;
    init.Fixed = (bool)(char)((uint)extraout_var_00 >> 8);
    init.Final = (bool)(char)((uint)extraout_var_00 >> 0x10);
    init.Target = (bool)(char)((uint)extraout_var_00 >> 0x18);
    ExpEmit::Free(&init,build);
  }
  loc = VMFunctionBuilder::Emit(build,0x44,0);
  VMFunctionBuilder::Backpatch(build,loc,sVar3);
  sVar3 = VMFunctionBuilder::GetAddress(build);
  VMFunctionBuilder::BackpatchListToHere(build,&no);
  FxLoopStatement::Backpatch(&this->super_FxLoopStatement,build,loopstart,sVar3);
  TArray<unsigned_long,_unsigned_long>::~TArray(&no);
  TArray<unsigned_long,_unsigned_long>::~TArray(&yes);
  EVar4.RegNum = 0;
  EVar4.RegType = 0x80;
  EVar4.RegCount = '\x01';
  EVar4.Konst = false;
  EVar4.Fixed = false;
  EVar4.Final = false;
  EVar4.Target = false;
  return EVar4;
}

Assistant:

ExpEmit FxForLoop::Emit(VMFunctionBuilder *build)
{
	assert((Condition && Condition->ValueType == TypeBool && !Condition->isConstant()) || Condition == nullptr);

	size_t loopstart, loopend;
	size_t codestart;
	TArray<size_t> yes, no;

	// Init statement (only used by DECORATE. ZScript is pulling it before the loop statement and enclosing the entire loop in a compound statement so that Init can have local variables.)
	if (Init != nullptr)
	{
		ExpEmit init = Init->Emit(build);
		init.Free(build);
	}

	// Evaluate the condition and execute/break out of the loop.
	codestart = build->GetAddress();
	if (Condition != nullptr)
	{
		Condition->EmitCompare(build, false, yes, no);
	}

	build->BackpatchListToHere(yes);
	// Execute the loop's content.
	if (Code != nullptr)
	{
		Code->EmitStatement(build);
	}

	// Iteration statement.
	loopstart = build->GetAddress();
	if (Iteration != nullptr)
	{
		ExpEmit iter = Iteration->Emit(build);
		iter.Free(build);
	}
	build->Backpatch(build->Emit(OP_JMP, 0), codestart);

	// End of loop.
	loopend = build->GetAddress();
	build->BackpatchListToHere(no);

	Backpatch(build, loopstart, loopend);
	return ExpEmit();
}